

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standalone_fuzz_target_runner.cc
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  long lVar2;
  size_t size;
  shared_ptr<char> file_buf;
  
  for (lVar2 = 1; lVar2 < argc; lVar2 = lVar2 + 1) {
    file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    size = 0;
    QUtil::read_file_into_memory(argv[lVar2],&file_buf,&size);
    LLVMFuzzerTestOneInput
              ((uchar *)file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,size);
    poVar1 = std::operator<<((ostream *)&std::cout,argv[lVar2]);
    poVar1 = std::operator<<(poVar1," successful");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return 0;
}

Assistant:

int
main(int argc, char** argv)
{
    for (int i = 1; i < argc; i++) {
        std::shared_ptr<char> file_buf;
        size_t size = 0;
        QUtil::read_file_into_memory(argv[i], file_buf, size);
        LLVMFuzzerTestOneInput(reinterpret_cast<unsigned char*>(file_buf.get()), size);
        std::cout << argv[i] << " successful" << std::endl;
    }
    return 0;
}